

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::String&,char_const*,char_const(&)[18],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],char_const*,kj::StringPtr&,char_const(&)[11],kj::StringPtr&,char_const(&)[73],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[3],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[16]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,String *params_1,
          char **params_2,char (*params_3) [18],CppTypeName *params_4,char (*params_5) [3],
          CppTypeName *params_6,char (*params_7) [2],char **params_8,StringPtr *params_9,
          char (*params_10) [11],StringPtr *params_11,char (*params_12) [73],CppTypeName *params_13,
          char (*params_14) [3],CppTypeName *params_15,char (*params_16) [12],
          CappedArray<char,_17UL> *params_17,char (*params_18) [6],unsigned_short *params_19,
          char (*params_20) [16])

{
  StringTree *pSVar1;
  String *value;
  char **ppcVar2;
  char (*value_00) [18];
  CppTypeName *pCVar3;
  char (*pacVar4) [3];
  char (*value_01) [2];
  StringPtr *pSVar5;
  char (*value_02) [11];
  char (*value_03) [73];
  char (*value_04) [12];
  CappedArray<char,_17UL> *value_05;
  char (*value_06) [6];
  unsigned_short *value_07;
  char (*value_08) [16];
  CppTypeName *value_09;
  CppTypeName *value_10;
  CppTypeName *value_11;
  CppTypeName *value_12;
  CappedArray<char,_8UL> local_1a8;
  CappedArray<char,_8UL> local_198;
  ArrayPtr<const_char> local_188;
  ArrayPtr<const_char> local_178;
  ArrayPtr<const_char> local_168;
  String local_158;
  ArrayPtr<const_char> local_140;
  String local_130;
  ArrayPtr<const_char> local_118;
  ArrayPtr<const_char> local_108;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  String local_b8;
  ArrayPtr<const_char> local_90;
  String local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  CppTypeName *local_38;
  CppTypeName *params_local_4;
  char (*params_local_3) [18];
  char **params_local_2;
  String *params_local_1;
  StringTree *params_local;
  
  local_38 = (CppTypeName *)params_3;
  params_local_4 = (CppTypeName *)params_2;
  params_local_3 = (char (*) [18])params_1;
  params_local_2 = (char **)params;
  params_local_1 = (String *)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = fwd<kj::String&>((String *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::String&>(value);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_3);
  local_58 = _::toStringTreeOrCharSequence<char_const*>(ppcVar2);
  value_00 = ::const((char (*) [18])params_local_4);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[18]>(value_00);
  pCVar3 = fwd<capnp::(anonymous_namespace)::CppTypeName&>(local_38);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_80,(_ *)pCVar3,value_09);
  pacVar4 = ::const((char (*) [3])params_4);
  local_90 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar4);
  pCVar3 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_5);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_b8,(_ *)pCVar3,value_10);
  value_01 = ::const((char (*) [2])params_6);
  local_c8 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_01);
  ppcVar2 = fwd<char_const*>((NoInfer<const_char_*> *)params_7);
  local_d8 = _::toStringTreeOrCharSequence<char_const*>(ppcVar2);
  pSVar5 = fwd<kj::StringPtr&>((StringPtr *)params_8);
  local_e8 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar5);
  value_02 = ::const((char (*) [11])params_9);
  local_f8 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value_02);
  pSVar5 = fwd<kj::StringPtr&>((StringPtr *)params_10);
  local_108 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar5);
  value_03 = ::const((char (*) [73])params_11);
  local_118 = _::toStringTreeOrCharSequence<char_const(&)[73]>(value_03);
  pCVar3 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_12);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_130,(_ *)pCVar3,value_11);
  pacVar4 = ::const((char (*) [3])params_13);
  local_140 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar4);
  pCVar3 = fwd<capnp::(anonymous_namespace)::CppTypeName&>((CppTypeName *)params_14);
  _::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_158,(_ *)pCVar3,value_12);
  value_04 = ::const((char (*) [12])params_15);
  local_168 = _::toStringTreeOrCharSequence<char_const(&)[12]>(value_04);
  value_05 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_16);
  local_178 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_05);
  value_06 = ::const((char (*) [6])params_17);
  local_188 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value_06);
  value_07 = fwd<unsigned_short&>((unsigned_short *)params_18);
  local_198 = _::toStringTreeOrCharSequence<unsigned_short&>(value_07);
  value_08 = ::const((char (*) [16])params_19);
  local_1a8 = (CappedArray<char,_8UL>)_::toStringTreeOrCharSequence<char_const(&)[16]>(value_08);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pSVar1,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_80,(String *)&local_90,(ArrayPtr<const_char> *)&local_b8
             ,(String *)&local_c8,&local_d8,&local_e8,&local_f8,&local_108,&local_118,
             (ArrayPtr<const_char> *)&local_130,(String *)&local_140,
             (ArrayPtr<const_char> *)&local_158,(String *)&local_168,&local_178,&local_188,
             (ArrayPtr<const_char> *)&local_198,&local_1a8,
             (ArrayPtr<const_char> *)&stack0xfffffffffffffce8);
  String::~String(&local_158);
  String::~String(&local_130);
  String::~String(&local_b8);
  String::~String(&local_80);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}